

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::NetDeclarationSyntax::NetDeclarationSyntax
          (NetDeclarationSyntax *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes
          ,Token netType,NetStrengthSyntax *strength,Token expansionHint,DataTypeSyntax *type,
          TimingControlSyntax *delay,
          SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *declarators,Token semi)

{
  Token TVar1;
  Token TVar2;
  bool bVar3;
  DataTypeSyntax *pDVar4;
  DeclaratorSyntax *pDVar5;
  DeclaratorSyntax *child;
  iterator __end2;
  iterator __begin2;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *__range2;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *local_38;
  DataTypeSyntax *type_local;
  NetStrengthSyntax *strength_local;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes_local;
  NetDeclarationSyntax *this_local;
  Token netType_local;
  
  TVar2 = semi;
  TVar1 = expansionHint;
  netType_local._0_8_ = netType.info;
  this_local = netType._0_8_;
  local_38 = (SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *)type;
  type_local = (DataTypeSyntax *)strength;
  strength_local = (NetStrengthSyntax *)attributes;
  attributes_local = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)this;
  MemberSyntax::MemberSyntax(&this->super_MemberSyntax,NetDeclaration,attributes);
  *(NetDeclarationSyntax **)&this->netType = this_local;
  (this->netType).info = (Info *)netType_local._0_8_;
  this->strength = (NetStrengthSyntax *)type_local;
  (this->expansionHint).kind = expansionHint.kind;
  (this->expansionHint).field_0x2 = expansionHint._2_1_;
  (this->expansionHint).numFlags = (NumericTokenFlags)expansionHint.numFlags.raw;
  (this->expansionHint).rawLen = expansionHint.rawLen;
  expansionHint.info = TVar1.info;
  (this->expansionHint).info = expansionHint.info;
  __range2 = local_38;
  not_null<slang::syntax::DataTypeSyntax*>::not_null<slang::syntax::DataTypeSyntax*,void>
            ((not_null<slang::syntax::DataTypeSyntax*> *)&this->type,(DataTypeSyntax **)&__range2);
  this->delay = delay;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::SeparatedSyntaxList
            (&this->declarators,declarators);
  (this->semi).kind = semi.kind;
  (this->semi).field_0x2 = semi._2_1_;
  (this->semi).numFlags = (NumericTokenFlags)semi.numFlags.raw;
  (this->semi).rawLen = semi.rawLen;
  semi.info = TVar2.info;
  (this->semi).info = semi.info;
  if (this->strength != (NetStrengthSyntax *)0x0) {
    (this->strength->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  pDVar4 = not_null<slang::syntax::DataTypeSyntax_*>::operator->(&this->type);
  (pDVar4->super_ExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)this;
  if (this->delay != (TimingControlSyntax *)0x0) {
    (this->delay->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  (this->declarators).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  join_0x00000010_0x00000000_ =
       SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::begin(&this->declarators);
  _child = SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::end(&this->declarators);
  while( true ) {
    bVar3 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<slang::syntax::DeclaratorSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::DeclaratorSyntax_*,_unsigned_long,_slang::syntax::DeclaratorSyntax_**,_slang::syntax::DeclaratorSyntax_*&>
            ::operator!=((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<slang::syntax::DeclaratorSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::DeclaratorSyntax_*,_unsigned_long,_slang::syntax::DeclaratorSyntax_**,_slang::syntax::DeclaratorSyntax_*&>
                          *)&__end2.index,(iterator_base<slang::syntax::DeclaratorSyntax_*> *)&child
                        );
    if (!bVar3) break;
    pDVar5 = SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::
             iterator_base<slang::syntax::DeclaratorSyntax_*>::operator*
                       ((iterator_base<slang::syntax::DeclaratorSyntax_*> *)&__end2.index);
    (pDVar5->super_SyntaxNode).parent = (SyntaxNode *)this;
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<slang::syntax::DeclaratorSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::DeclaratorSyntax_*,_unsigned_long,_slang::syntax::DeclaratorSyntax_**,_slang::syntax::DeclaratorSyntax_*&>
    ::operator++((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<slang::syntax::DeclaratorSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::DeclaratorSyntax_*,_unsigned_long,_slang::syntax::DeclaratorSyntax_**,_slang::syntax::DeclaratorSyntax_*&>
                  *)&__end2.index);
  }
  return;
}

Assistant:

NetDeclarationSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token netType, NetStrengthSyntax* strength, Token expansionHint, DataTypeSyntax& type, TimingControlSyntax* delay, const SeparatedSyntaxList<DeclaratorSyntax>& declarators, Token semi) :
        MemberSyntax(SyntaxKind::NetDeclaration, attributes), netType(netType), strength(strength), expansionHint(expansionHint), type(&type), delay(delay), declarators(declarators), semi(semi) {
        if (this->strength) this->strength->parent = this;
        this->type->parent = this;
        if (this->delay) this->delay->parent = this;
        this->declarators.parent = this;
        for (auto child : this->declarators)
            child->parent = this;
    }